

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::GlassMaterial::readFrom(GlassMaterial *this,BinaryReader *binary)

{
  size_t sVar1;
  pointer puVar2;
  undefined8 uVar3;
  size_t sVar4;
  runtime_error *this_00;
  
  Material::readFrom(&this->super_Material,binary);
  sVar1 = binary->currentEntityOffset;
  puVar2 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2) < sVar1 + 0xc) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    (this->kr).z = *(float *)(puVar2 + sVar1 + 8);
    uVar3 = *(undefined8 *)(puVar2 + sVar1);
    (this->kr).x = (float)(int)uVar3;
    (this->kr).y = (float)(int)((ulong)uVar3 >> 0x20);
    sVar1 = binary->currentEntityOffset;
    binary->currentEntityOffset = sVar1 + 0xc;
    puVar2 = (binary->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(binary->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2) < sVar1 + 0x18) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
    else {
      (this->kt).z = *(float *)(puVar2 + sVar1 + 0x14);
      uVar3 = *(undefined8 *)(puVar2 + sVar1 + 0xc);
      (this->kt).x = (float)(int)uVar3;
      (this->kt).y = (float)(int)((ulong)uVar3 >> 0x20);
      sVar4 = binary->currentEntityOffset;
      sVar1 = sVar4 + 0xc;
      binary->currentEntityOffset = sVar1;
      puVar2 = (binary->currentEntityData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (sVar4 + 0x10 <=
          (ulong)((long)(binary->currentEntityData).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2)) {
        this->index = *(float *)(puVar2 + sVar1);
        binary->currentEntityOffset = binary->currentEntityOffset + 4;
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void GlassMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(kr);
    binary.read(kt);
    binary.read(index);
  }